

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O2

bool NotEqual(cbtDbvtAabbMm *a,cbtDbvtAabbMm *b)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  
  fVar1 = (a->mi).m_floats[0];
  fVar2 = (b->mi).m_floats[0];
  if ((((((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) &&
        (fVar1 = (a->mi).m_floats[1], fVar2 = (b->mi).m_floats[1], fVar1 == fVar2)) &&
       ((!NAN(fVar1) && !NAN(fVar2) &&
        (fVar1 = (a->mi).m_floats[2], fVar2 = (b->mi).m_floats[2], fVar1 == fVar2)))) &&
      ((!NAN(fVar1) && !NAN(fVar2) &&
       ((fVar1 = (a->mx).m_floats[0], fVar2 = (b->mx).m_floats[0], fVar1 == fVar2 &&
        (!NAN(fVar1) && !NAN(fVar2))))))) &&
     ((fVar1 = (a->mx).m_floats[1], fVar2 = (b->mx).m_floats[1], fVar1 == fVar2 &&
      (!NAN(fVar1) && !NAN(fVar2))))) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)(a->mx).m_floats[2]),ZEXT416((uint)(b->mx).m_floats[2]),4);
    return (bool)((byte)uVar3 & 1);
  }
  return true;
}

Assistant:

DBVT_INLINE bool NotEqual(const cbtDbvtAabbMm& a,
						  const cbtDbvtAabbMm& b)
{
	return ((a.mi.x() != b.mi.x()) ||
			(a.mi.y() != b.mi.y()) ||
			(a.mi.z() != b.mi.z()) ||
			(a.mx.x() != b.mx.x()) ||
			(a.mx.y() != b.mx.y()) ||
			(a.mx.z() != b.mx.z()));
}